

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullaryFunctors.h
# Opt level: O2

bool __thiscall
Eigen::
DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
::all(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
      *this)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  bVar2 = false;
  do {
    if (bVar2) {
      return bVar2;
    }
    lVar3 = (*(long **)(this + 0x20))[1];
    if (lVar3 < 1) {
      lVar3 = 0;
    }
    lVar4 = 0;
    while (lVar3 != lVar4) {
      lVar1 = lVar4 * 8;
      lVar4 = lVar4 + 1;
      if (*(double *)(**(long **)(this + 0x20) + lVar1) <= *(double *)(this + 0x18)) {
        return bVar2;
      }
    }
    bVar2 = true;
  } while( true );
}

Assistant:

const Scalar operator() () const { return m_other; }